

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

void * utf8casestr(void *haystack,void *needle)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  char *in_RAX;
  char *pcVar4;
  char *pcVar5;
  byte *pbVar6;
  char *h;
  char *pcVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  
  if (*needle == '\0') {
    return haystack;
  }
  do {
    pcVar4 = (char *)haystack;
    if (*pcVar4 == '\0') {
      return (void *)0x0;
    }
    pcVar5 = pcVar4 + -1;
    pbVar2 = (byte *)needle;
    pcVar3 = pcVar4;
    do {
      pcVar7 = pcVar3;
      pbVar6 = pbVar2;
      bVar1 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
      bVar8 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar8 = bVar1;
      }
      bVar1 = *pbVar6;
      bVar9 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar9 = bVar1;
      }
      bVar10 = bVar8 == bVar9;
      pbVar2 = pbVar6 + 1;
      pcVar3 = pcVar7 + 1;
    } while (bVar10);
    haystack = pcVar5 + bVar10;
    if ((pbVar6[bVar10] != 0) && (pcVar4 = in_RAX, *haystack != '\0')) {
      haystack = pcVar7 + (ulong)bVar10 + 1;
    }
    in_RAX = pcVar4;
  } while (pbVar6[bVar10] != 0);
  return pcVar4;
}

Assistant:

void *utf8casestr(const void *haystack, const void *needle) {
  const char *h = (const char *)haystack;

  // if needle has no utf8 codepoints before the null terminating
  // byte then return haystack
  if ('\0' == *((const char *)needle)) {
    return (void *)haystack;
  }

  while ('\0' != *h) {
    const char *maybeMatch = h;
    const char *n = (const char *)needle;

    for (;;) {
      char a = *h;
      char b = *n;
      // not entirely correct, but good enough
      if (('A' <= a) && ('Z' >= a)) {
        a |= 0x20; // make a lowercase
      }

      if (('A' <= b) && ('Z' >= b)) {
        b |= 0x20; // make b lowercase
      }

      // if we find a mismatch, bail out!
      if (a != b) {
        break;
      }

      n++;
      h++;
    }

    if ('\0' == *n) {
      // we found the whole utf8 string for needle in haystack at
      // maybeMatch, so return it
      return (void *)maybeMatch;
    } else {
      // h could be in the middle of an unmatching utf8 codepoint,
      // so we need to march it on to the next character beginning,
      if ('\0' != *h) {
        do {
          h++;
        } while (0x80 == (0xc0 & *h));
      }
    }
  }

  // no match
  return 0;
}